

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_enc.c
# Opt level: O0

int WebPConfigInitInternal(WebPConfig *config,WebPPreset preset,float quality,int version)

{
  int in_EDX;
  undefined4 in_ESI;
  WebPConfig *in_RDI;
  float in_XMM0_Da;
  int local_4;
  
  if (in_EDX >> 8 == 2) {
    if (in_RDI == (WebPConfig *)0x0) {
      local_4 = 0;
    }
    else {
      in_RDI->quality = in_XMM0_Da;
      in_RDI->target_size = 0;
      in_RDI->target_PSNR = 0.0;
      in_RDI->method = 4;
      in_RDI->sns_strength = 0x32;
      in_RDI->filter_strength = 0x3c;
      in_RDI->filter_sharpness = 0;
      in_RDI->filter_type = 1;
      in_RDI->partitions = 0;
      in_RDI->segments = 4;
      in_RDI->pass = 1;
      in_RDI->qmin = 0;
      in_RDI->qmax = 100;
      in_RDI->show_compressed = 0;
      in_RDI->preprocessing = 0;
      in_RDI->autofilter = 0;
      in_RDI->partition_limit = 0;
      in_RDI->alpha_compression = 1;
      in_RDI->alpha_filtering = 1;
      in_RDI->alpha_quality = 100;
      in_RDI->lossless = 0;
      in_RDI->exact = 0;
      in_RDI->image_hint = WEBP_HINT_DEFAULT;
      in_RDI->emulate_jpeg_size = 0;
      in_RDI->thread_level = 0;
      in_RDI->low_memory = 0;
      in_RDI->near_lossless = 100;
      in_RDI->use_sharp_yuv = 0;
      switch(in_ESI) {
      case 0:
        break;
      case 1:
        in_RDI->sns_strength = 0x50;
        in_RDI->filter_sharpness = 4;
        in_RDI->filter_strength = 0x23;
        in_RDI->preprocessing = in_RDI->preprocessing & 0xfffffffd;
        break;
      case 2:
        in_RDI->sns_strength = 0x50;
        in_RDI->filter_sharpness = 3;
        in_RDI->filter_strength = 0x1e;
        in_RDI->preprocessing = in_RDI->preprocessing | 2;
        break;
      case 3:
        in_RDI->sns_strength = 0x19;
        in_RDI->filter_sharpness = 6;
        in_RDI->filter_strength = 10;
        break;
      case 4:
        in_RDI->sns_strength = 0;
        in_RDI->filter_strength = 0;
        in_RDI->preprocessing = in_RDI->preprocessing & 0xfffffffd;
        break;
      case 5:
        in_RDI->sns_strength = 0;
        in_RDI->filter_strength = 0;
        in_RDI->preprocessing = in_RDI->preprocessing & 0xfffffffd;
        in_RDI->segments = 2;
      }
      local_4 = WebPValidateConfig(in_RDI);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int WebPConfigInitInternal(WebPConfig* config,
                           WebPPreset preset, float quality, int version) {
  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_ENCODER_ABI_VERSION)) {
    return 0;   // caller/system version mismatch!
  }
  if (config == NULL) return 0;

  config->quality = quality;
  config->target_size = 0;
  config->target_PSNR = 0.;
  config->method = 4;
  config->sns_strength = 50;
  config->filter_strength = 60;   // mid-filtering
  config->filter_sharpness = 0;
  config->filter_type = 1;        // default: strong (so U/V is filtered too)
  config->partitions = 0;
  config->segments = 4;
  config->pass = 1;
  config->qmin = 0;
  config->qmax = 100;
  config->show_compressed = 0;
  config->preprocessing = 0;
  config->autofilter = 0;
  config->partition_limit = 0;
  config->alpha_compression = 1;
  config->alpha_filtering = 1;
  config->alpha_quality = 100;
  config->lossless = 0;
  config->exact = 0;
  config->image_hint = WEBP_HINT_DEFAULT;
  config->emulate_jpeg_size = 0;
  config->thread_level = 0;
  config->low_memory = 0;
  config->near_lossless = 100;
  config->use_sharp_yuv = 0;

  // TODO(skal): tune.
  switch (preset) {
    case WEBP_PRESET_PICTURE:
      config->sns_strength = 80;
      config->filter_sharpness = 4;
      config->filter_strength = 35;
      config->preprocessing &= ~2;   // no dithering
      break;
    case WEBP_PRESET_PHOTO:
      config->sns_strength = 80;
      config->filter_sharpness = 3;
      config->filter_strength = 30;
      config->preprocessing |= 2;
      break;
    case WEBP_PRESET_DRAWING:
      config->sns_strength = 25;
      config->filter_sharpness = 6;
      config->filter_strength = 10;
      break;
    case WEBP_PRESET_ICON:
      config->sns_strength = 0;
      config->filter_strength = 0;   // disable filtering to retain sharpness
      config->preprocessing &= ~2;   // no dithering
      break;
    case WEBP_PRESET_TEXT:
      config->sns_strength = 0;
      config->filter_strength = 0;   // disable filtering to retain sharpness
      config->preprocessing &= ~2;   // no dithering
      config->segments = 2;
      break;
    case WEBP_PRESET_DEFAULT:
    default:
      break;
  }
  return WebPValidateConfig(config);
}